

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preserve_unknown_enum_test.cc
# Opt level: O0

void __thiscall
google::protobuf::PreserveUnknownEnumTest_PreserveParseAndSerialize_Test::TestBody
          (PreserveUnknownEnumTest_PreserveParseAndSerialize_Test *this)

{
  string *output;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_180;
  Message local_178;
  string_view local_170;
  bool local_15a;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  Message local_140;
  string_view local_138;
  bool local_122;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  MyMessage message;
  string serialized;
  undefined1 local_78 [8];
  MyMessagePlusExtra orig_message;
  PreserveUnknownEnumTest_PreserveParseAndSerialize_Test *this_local;
  
  orig_message.field_0._80_8_ = this;
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::MyMessagePlusExtra
            ((MyMessagePlusExtra *)local_78);
  anon_unknown_15::FillMessage((MyMessagePlusExtra *)local_78);
  output = (string *)((long)&message.field_0 + 0x50);
  std::__cxx11::string::string((string *)output);
  protobuf::MessageLite::SerializeToString((MessageLite *)local_78,output);
  proto3_preserve_unknown_enum_unittest::MyMessage::MyMessage((MyMessage *)&gtest_ar.message_);
  local_121 = true;
  local_138 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)((long)&message.field_0 + 0x50));
  local_122 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar.message_,local_138);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_120,"true","message.ParseFromString(serialized)",&local_121,
             &local_122);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  anon_unknown_15::CheckMessage((MyMessage *)&gtest_ar.message_);
  std::__cxx11::string::clear();
  protobuf::MessageLite::SerializeToString
            ((MessageLite *)&gtest_ar.message_,(string *)((long)&message.field_0 + 0x50));
  local_159 = true;
  local_170 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)((long)&message.field_0 + 0x50));
  local_15a = protobuf::MessageLite::ParseFromString((MessageLite *)local_78,local_170);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_158,"true","orig_message.ParseFromString(serialized)",&local_159,
             &local_15a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/preserve_unknown_enum_test.cc"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  anon_unknown_15::CheckMessage((MyMessagePlusExtra *)local_78);
  proto3_preserve_unknown_enum_unittest::MyMessage::~MyMessage((MyMessage *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)((long)&message.field_0 + 0x50));
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::~MyMessagePlusExtra
            ((MyMessagePlusExtra *)local_78);
  return;
}

Assistant:

TEST(PreserveUnknownEnumTest, PreserveParseAndSerialize) {
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra orig_message;
  FillMessage(&orig_message);
  std::string serialized;
  orig_message.SerializeToString(&serialized);

  proto3_preserve_unknown_enum_unittest::MyMessage message;
  EXPECT_EQ(true, message.ParseFromString(serialized));
  CheckMessage(message);

  serialized.clear();
  message.SerializeToString(&serialized);
  EXPECT_EQ(true, orig_message.ParseFromString(serialized));
  CheckMessage(orig_message);
}